

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoPrism> *this,TPZVec<long> *nodeindexes)

{
  long lVar1;
  
  TPZGeoPrism::TPZGeoPrism(&this->super_TPZGeoPrism,&PTR_PTR_016c40b8,nodeindexes);
  (this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.super_TPZPrism.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_016c4060;
  lVar1 = 0x50;
  do {
    *(undefined ***)
     ((long)(this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
     lVar1 + -0x18) = &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
     lVar1 + -8) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->super_TPZGeoPrism).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
     lVar1 + -0x10) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1d0);
  lVar1 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)(&this->field_0x1c0 + lVar1));
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x1a00);
  return;
}

Assistant:

TPZGeoBlend(TPZVec<int64_t> &nodeindexes) : TPZRegisterClassId(&TPZGeoBlend::ClassId),
                                                    TGeo(nodeindexes) {
        }